

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::SetTraceFile(cmake *this,string *file)

{
  _Ios_Openmode _Var1;
  ulong uVar2;
  ostream *poVar3;
  string local_1f0;
  string local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190;
  string *local_18;
  string *file_local;
  cmake *this_local;
  
  local_18 = file;
  file_local = (string *)this;
  std::ofstream::close();
  _Var1 = std::__cxx11::string::c_str();
  std::ofstream::open((char *)&this->TraceFile,_Var1);
  uVar2 = std::ios::operator!((ios *)((this->TraceFile).super_ofstream.
                                      super_basic_ostream<char,_std::char_traits<char>_>.
                                      _vptr_basic_ostream[-3] +
                                     (long)&(this->TraceFile).super_ofstream.
                                            super_basic_ostream<char,_std::char_traits<char>_>.
                                            _vptr_basic_ostream));
  if ((uVar2 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Trace will be written to ");
    poVar3 = std::operator<<(poVar3,(string *)local_18);
    std::operator<<(poVar3,"\n");
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar3 = std::operator<<(&local_190,"Error opening trace file ");
    poVar3 = std::operator<<(poVar3,(string *)local_18);
    poVar3 = std::operator<<(poVar3,": ");
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    std::operator<<(poVar3,local_1d0);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::stringstream::str();
    cmSystemTools::Error(&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  return;
}

Assistant:

void cmake::SetTraceFile(const std::string& file)
{
  this->TraceFile.close();
  this->TraceFile.open(file.c_str());
  if (!this->TraceFile) {
    std::stringstream ss;
    ss << "Error opening trace file " << file << ": "
       << cmSystemTools::GetLastSystemError();
    cmSystemTools::Error(ss.str());
    return;
  }
  std::cout << "Trace will be written to " << file << "\n";
}